

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O3

FT_Bool get_child_table_pointer
                  (Colr *colr,FT_Byte *paint_base,FT_Byte **p,FT_Byte **child_table_pointer)

{
  byte *pbVar1;
  FT_ULong FVar2;
  uint uVar3;
  FT_Byte *pFVar4;
  
  if (((child_table_pointer != (FT_Byte **)0x0) && (pbVar1 = *p, colr->paints_start_v1 <= pbVar1))
     && (FVar2 = colr->table_size, pbVar1 <= (byte *)((long)colr->table + (FVar2 - 4)))) {
    *p = pbVar1 + 3;
    uVar3 = (uint)pbVar1[2] | (uint)pbVar1[1] << 8 | (uint)*pbVar1 << 0x10;
    if (((uVar3 != 0) && (pFVar4 = paint_base + uVar3, colr->paints_start_v1 <= pFVar4)) &&
       (pFVar4 < (FT_Byte *)(FVar2 + (long)colr->table))) {
      *child_table_pointer = pFVar4;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static FT_Bool
  get_child_table_pointer ( Colr*      colr,
                            FT_Byte*   paint_base,
                            FT_Byte**  p,
                            FT_Byte**  child_table_pointer )
  {
    FT_UInt32  paint_offset;
    FT_Byte*   child_table_p;


    if ( !child_table_pointer )
      return 0;

    if ( *p < colr->paints_start_v1                            ||
         *p > (FT_Byte*)colr->table + colr->table_size - 1 - 3 )
      return 0;

    paint_offset = FT_NEXT_UOFF3( *p );
    if ( !paint_offset )
      return 0;

    child_table_p = (FT_Byte*)( paint_base + paint_offset );

    if ( child_table_p < colr->paints_start_v1                         ||
         child_table_p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    *child_table_pointer = child_table_p;
    return 1;
  }